

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O3

ILayer * __thiscall
DenseLifLayer::Backward(DenseLifLayer *this,vector<float,_std::allocator<float>_> *deltas)

{
  INeuron *pIVar1;
  int iVar2;
  pointer ppIVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  pointer ppIVar7;
  long lVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar10;
  undefined1 auVar11 [16];
  float local_44;
  
  ppIVar3 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar7 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar9 = 0.0;
  if (ppIVar3 == ppIVar7) {
    local_44 = 0.0;
    lVar8 = 0;
    dVar10 = 0.0;
    ppIVar7 = ppIVar3;
  }
  else {
    local_44 = 0.0;
    lVar8 = 0;
    do {
      pIVar1 = *ppIVar3;
      (*pIVar1->_vptr_INeuron[4])(pIVar1);
      local_44 = local_44 + extraout_XMM0_Da;
      iVar2 = INeuron::GetOutputSpikeCounter(pIVar1);
      lVar8 = lVar8 + (ulong)(0 < iVar2);
      (*pIVar1->_vptr_INeuron[0xb])(pIVar1);
      (*pIVar1->_vptr_INeuron[0xb])(pIVar1);
      fVar9 = fVar9 + (1.0 / extraout_XMM0_Da_00) / extraout_XMM0_Da_01;
      ppIVar3 = ppIVar3 + 1;
    } while (ppIVar3 != ppIVar7);
    ppIVar3 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar10 = (double)fVar9;
    ppIVar7 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar4 = (long)ppIVar3 - (long)ppIVar7 >> 3;
  auVar11._8_4_ = (int)((long)ppIVar3 - (long)ppIVar7 >> 0x23);
  auVar11._0_8_ = lVar4;
  auVar11._12_4_ = 0x45300000;
  dVar10 = dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  if (dVar10 < 0.0) {
    sqrt(dVar10);
  }
  sVar5 = ILayer::GetSize(&this->super_ILayer);
  if (sVar5 != 0) {
    uVar6 = 0;
    do {
      pIVar1 = (this->super_ILayer).neurons.
               super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      (*pIVar1->_vptr_INeuron[7])((ulong)(uint)local_44,pIVar1,(this->super_ILayer).meta.size,lVar8)
      ;
      uVar6 = uVar6 + 1;
      sVar5 = ILayer::GetSize(&this->super_ILayer);
    } while (uVar6 < sVar5);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Backward( const std::vector<float> &deltas )
{
    float totalLayerOutput = 0;
    size_t activeNeurons = 0;
    float meanReversedSquaredThresholds = 0;
    for ( auto neuron: neurons ) {
        totalLayerOutput += neuron->GetOutput();
        activeNeurons += neuron->GetOutputSpikeCounter() > 0;
        meanReversedSquaredThresholds += 1. / neuron->GetMaxMP() / neuron->GetMaxMP();
    }
    meanReversedSquaredThresholds = sqrt( 1. * meanReversedSquaredThresholds / neurons.size() );

    for ( int idx = 0; idx < GetSize(); ++idx ) {
        float delta = 0;
        if ( !deltas.empty()) {
            delta = deltas[idx];
        }
        neurons[idx]->Backward( totalLayerOutput, delta, meta.size, activeNeurons, meanReversedSquaredThresholds );
    }
    return *this;
}